

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

string * __thiscall
Character::GuildRankString_abi_cxx11_(string *__return_storage_ptr__,Character *this)

{
  World *pWVar1;
  bool bVar2;
  mapped_type *this_00;
  element_type *this_01;
  byte local_92;
  allocator<char> local_51;
  key_type local_50;
  allocator<char> local_19;
  Character *local_18;
  Character *this_local;
  
  local_18 = this;
  this_local = (Character *)__return_storage_ptr__;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->guild);
  if (bVar2) {
    pWVar1 = this->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"GuildCustomRanks",&local_51);
    this_00 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
              ::operator[](&(pWVar1->config).
                            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           ,&local_50);
    bVar2 = util::variant::operator_cast_to_bool(this_00);
    local_92 = 0;
    if (bVar2) {
      local_92 = std::__cxx11::string::empty();
      local_92 = local_92 ^ 0xff;
    }
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    if ((local_92 & 1) == 0) {
      this_01 = std::__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Guild,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           &this->guild);
      Guild::GetRank_abi_cxx11_(__return_storage_ptr__,this_01,(uint)this->guild_rank);
    }
    else {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)&this->guild_rank_string);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Character::GuildRankString()
{
	if (!this->guild)
		return "";

	if (this->world->config["GuildCustomRanks"] && !this->guild_rank_string.empty())
	{
		return this->guild_rank_string;
	}
	else
	{
		return this->guild->GetRank(this->guild_rank);
	}
}